

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::ktx2_transcoder::transcode_image_level
          (ktx2_transcoder *this,uint32_t level_index,uint32_t layer_index,uint32_t face_index,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,
          transcoder_texture_format fmt,uint32_t decode_flags,
          uint32_t output_row_pitch_in_blocks_or_pixels,uint32_t output_rows_in_pixels,int channel0,
          int channel1,ktx2_transcoder_state *pState)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  basisu_lowlevel_uastc_transcoder *this_00;
  ulong uVar9;
  endpoint_vec *this_01;
  uint in_ECX;
  uint output_blocks_buf_size_in_blocks_or_pixels_00;
  uint uVar10;
  uint in_EDX;
  uint32_t unaff_EBX;
  uint32_t unaff_EBP;
  uint in_ESI;
  long *in_RDI;
  basisu_lowlevel_etc1s_transcoder *in_R8;
  transcoder_texture_format in_R9D;
  uint32_t unaff_R12D;
  uint32_t unaff_R13D;
  uint32_t unaff_R14D;
  uint32_t unaff_R15D;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000028;
  undefined4 in_stack_0000002c;
  uint32_t in_stack_00000030;
  uint32_t uStack0000000000000038;
  int in_stack_00000040;
  uint32_t in_stack_00000050;
  basisu_transcoder_state *in_stack_00000058;
  uint32_t in_stack_00000060;
  uint32_t uncomp_ofs;
  uint32_t total_2D_image_size;
  ktx2_etc1s_image_desc *image_desc;
  uint32_t etc1s_image_index;
  uint32_t num_blocks_y;
  uint32_t num_blocks_x;
  uint32_t level_height;
  uint32_t level_width;
  uint64_t uncomp_level_data_size;
  uint8_t *pUncomp_level_data;
  uint64_t comp_level_data_size;
  uint8_t *pComp_level_data;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ulong uVar11;
  uint32_t output_blocks_buf_size_in_blocks_or_pixels_01;
  basisu_lowlevel_uastc_transcoder *pOutput_blocks_00;
  bool local_31;
  
  if (*in_RDI == 0) {
    local_31 = false;
  }
  else {
    if (_uStack0000000000000038 == (long *)0x0) {
      _uStack0000000000000038 = in_RDI + 0x7e;
    }
    uVar3 = basisu::vector<basist::ktx2_level_index>::size
                      ((vector<basist::ktx2_level_index> *)(in_RDI + 0xc));
    if (in_ESI < uVar3) {
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      if (uVar3 < 2) {
        if (in_ECX != 0) {
          return false;
        }
      }
      else if (5 < in_ECX) {
        return false;
      }
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      uVar4 = basisu::maximum<unsigned_int>(uVar3,1);
      if (in_EDX < uVar4) {
        lVar1 = *in_RDI;
        basisu::vector<basist::ktx2_level_index>::operator[]
                  ((vector<basist::ktx2_level_index> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<8U> *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        this_00 = (basisu_lowlevel_uastc_transcoder *)(lVar1 + (ulong)uVar3);
        basisu::vector<basist::ktx2_level_index>::operator[]
                  ((vector<basist::ktx2_level_index> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<8U> *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        uVar9 = (ulong)uVar3;
        if (uVar9 < 0x100000000) {
          uVar11 = uVar9;
          pOutput_blocks_00 = this_00;
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          output_blocks_buf_size_in_blocks_or_pixels_01 = (uint32_t)(uVar11 >> 0x20);
          if (uVar3 == 2) {
            if (in_ESI != *(uint *)(_uStack0000000000000038 + 0x46)) {
              bVar2 = decompress_level_data
                                ((ktx2_transcoder *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 in_stack_fffffffffffffe54,
                                 (uint8_vec *)
                                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              if (!bVar2) {
                return false;
              }
              *(uint *)(_uStack0000000000000038 + 0x46) = in_ESI;
            }
            this_00 = (basisu_lowlevel_uastc_transcoder *)
                      basisu::vector<unsigned_char>::data
                                ((vector<unsigned_char> *)(_uStack0000000000000038 + 0x44));
            uVar3 = basisu::vector<unsigned_char>::size
                              ((vector<unsigned_char> *)(_uStack0000000000000038 + 0x44));
            uVar9 = (ulong)uVar3;
          }
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          uVar4 = basisu::maximum<unsigned_int>(uVar3 >> ((byte)in_ESI & 0x1f),1);
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          uVar5 = basisu::maximum<unsigned_int>(uVar3 >> ((byte)in_ESI & 0x1f),1);
          output_blocks_buf_size_in_blocks_or_pixels_00 = uVar4 + 3 >> 2;
          uVar10 = uVar5 + 3;
          if ((int)in_RDI[0x17] == 0) {
            this_01 = basisu_lowlevel_etc1s_transcoder::get_endpoints
                                ((basisu_lowlevel_etc1s_transcoder *)(in_RDI + 0x1b));
            bVar2 = basisu::vector<basist::endpoint>::empty(this_01);
            if (bVar2) {
              return false;
            }
            uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<4U> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            uVar4 = basisu::maximum<unsigned_int>(uVar3,1);
            uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<4U> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            uVar6 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<4U> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            uVar7 = basisu::vector<basist::ktx2_etc1s_image_desc>::size
                              ((vector<basist::ktx2_etc1s_image_desc> *)(in_RDI + 0x15));
            if (uVar7 <= in_ESI * uVar4 * uVar3 + in_EDX * uVar6 + in_ECX) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x42f9,
                            "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                           );
            }
            if ((int)in_RDI[1] != (int)in_RDI[1]) {
              return false;
            }
            basisu::vector<basist::ktx2_etc1s_image_desc>::operator[]
                      ((vector<basist::ktx2_etc1s_image_desc> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            basisu::vector<basist::ktx2_level_index>::operator[]
                      ((vector<basist::ktx2_level_index> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<8U> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<4U> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            if (uVar3 != 0) {
              basisu::vector<basist::ktx2_level_index>::operator[]
                        ((vector<basist::ktx2_level_index> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
              basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<8U> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              basisu::packed_uint::operator_cast_to_unsigned_int
                        ((packed_uint<4U> *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            }
            basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            bVar2 = basisu_lowlevel_etc1s_transcoder::transcode_image
                              (in_R8,in_R9D,pOutput_blocks_00,
                               output_blocks_buf_size_in_blocks_or_pixels_01,(uint8_t *)this_00,
                               (uint32_t)(uVar9 >> 0x20),unaff_R15D,unaff_EBP,unaff_retaddr,
                               in_stack_00000008,in_stack_00000010,in_stack_00000018,
                               in_stack_00000020,in_stack_00000028,in_stack_00000030,
                               uStack0000000000000038,SUB81(uVar9 >> 0x18,0),SUB81(uVar9 >> 0x10,0),
                               in_stack_00000050,in_stack_00000058,in_stack_00000060);
            if (!bVar2) {
              return false;
            }
          }
          else {
            if ((int)in_RDI[0x17] != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x4335,
                            "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                           );
            }
            uVar11 = uVar9;
            basisu::vector<basist::ktx2_level_index>::operator[]
                      ((vector<basist::ktx2_level_index> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<8U> *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            if (uVar9 != uVar3) {
              __assert_fail("uncomp_level_data_size == m_levels[level_index].m_uncompressed_byte_length"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x4315,
                            "bool basist::ktx2_transcoder::transcode_image_level(uint32_t, uint32_t, uint32_t, void *, uint32_t, basist::transcoder_texture_format, uint32_t, uint32_t, uint32_t, int, int, ktx2_transcoder_state *)"
                           );
            }
            uVar10 = output_blocks_buf_size_in_blocks_or_pixels_00 * (uVar10 >> 2) * 0x10;
            uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                              ((packed_uint<4U> *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            uVar8 = (in_EDX * uVar3 + in_ECX) * uVar10;
            if (uVar11 <= uVar8) {
              return false;
            }
            if (uVar11 - uVar8 < (ulong)uVar10) {
              return false;
            }
            bVar2 = basisu_lowlevel_uastc_transcoder::transcode_image
                              (this_00,(transcoder_texture_format)(uVar11 >> 0x20),
                               (void *)CONCAT44(uVar4,uVar5),
                               output_blocks_buf_size_in_blocks_or_pixels_00,
                               (uint8_t *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),unaff_EBX,
                               unaff_R12D,unaff_R13D,unaff_R14D,unaff_R15D,unaff_EBP,unaff_retaddr,
                               in_stack_00000008,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x18,0),
                               SUB81((ulong)in_stack_ffffffffffffff60 >> 0x10,0),in_stack_00000020,
                               (basisu_transcoder_state *)
                               CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000030,
                               uStack0000000000000038,in_stack_00000040);
            if (!bVar2) {
              return false;
            }
          }
          local_31 = true;
        }
        else {
          local_31 = false;
        }
      }
      else {
        local_31 = false;
      }
    }
    else {
      local_31 = false;
    }
  }
  return local_31;
}

Assistant:

bool ktx2_transcoder::transcode_image_level(
		uint32_t level_index, uint32_t layer_index, uint32_t face_index, 
		void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
		basist::transcoder_texture_format fmt,
		uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, uint32_t output_rows_in_pixels, int channel0, int channel1,
		ktx2_transcoder_state* pState)
	{
		if (!m_pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: Must call init() first\n");
			return false;
		}

		if (!pState)
			pState = &m_def_transcoder_state;
										
		if (level_index >= m_levels.size())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: level_index >= m_levels.size()\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			if (face_index >= 6)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: face_index >= 6\n");
				return false;
			}
		}
		else if (face_index != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: face_index != 0\n");
			return false;
		}

		if (layer_index >= basisu::maximum<uint32_t>(m_header.m_layer_count, 1))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: layer_index >= maximum<uint32_t>(m_header.m_layer_count, 1)\n");
			return false;
		}

		const uint8_t* pComp_level_data = m_pData + m_levels[level_index].m_byte_offset;
		uint64_t comp_level_data_size = m_levels[level_index].m_byte_length;
		
		const uint8_t* pUncomp_level_data = pComp_level_data;
		uint64_t uncomp_level_data_size = comp_level_data_size;

		if (uncomp_level_data_size > UINT32_MAX)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: uncomp_level_data_size > UINT32_MAX\n");
			return false;
		}
				
		if (m_header.m_supercompression_scheme == KTX2_SS_ZSTANDARD)
		{
			// Check if we've already decompressed this level's supercompressed data.
			if ((int)level_index != pState->m_uncomp_data_level_index)
			{
				// Uncompress the entire level's supercompressed data.
				if (!decompress_level_data(level_index, pState->m_level_uncomp_data))
				{
					BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: decompress_level_data() failed\n");
					return false;
				}
				pState->m_uncomp_data_level_index = level_index;
			}

			pUncomp_level_data = pState->m_level_uncomp_data.data();
			uncomp_level_data_size = pState->m_level_uncomp_data.size();
		}
				
		const uint32_t level_width = basisu::maximum<uint32_t>(m_header.m_pixel_width >> level_index, 1);
		const uint32_t level_height = basisu::maximum<uint32_t>(m_header.m_pixel_height >> level_index, 1);
		const uint32_t num_blocks_x = (level_width + 3) >> 2;
		const uint32_t num_blocks_y = (level_height + 3) >> 2;
		
		if (m_format == basist::basis_tex_format::cETC1S)
		{
			// Ensure start_transcoding() was called.
			if (m_etc1s_transcoder.get_endpoints().empty())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: must call start_transcoding() first\n");
				return false;
			}

			const uint32_t etc1s_image_index =
				(level_index * basisu::maximum<uint32_t>(m_header.m_layer_count, 1) * m_header.m_face_count) +
				layer_index * m_header.m_face_count +
				face_index;
		
			// Sanity check
			if (etc1s_image_index >= m_etc1s_image_descs.size())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: etc1s_image_index >= m_etc1s_image_descs.size()\n");
				assert(0);
				return false;
			}

			if (static_cast<uint32_t>(m_data_size) != m_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: File is too large\n");
				return false;
			}

			const ktx2_etc1s_image_desc& image_desc = m_etc1s_image_descs[etc1s_image_index];

			if (!m_etc1s_transcoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, m_pData, static_cast<uint32_t>(m_data_size),
				num_blocks_x, num_blocks_y, level_width, level_height,
				level_index,
				m_levels[level_index].m_byte_offset + image_desc.m_rgb_slice_byte_offset, image_desc.m_rgb_slice_byte_length,
				image_desc.m_alpha_slice_byte_length ? (m_levels[level_index].m_byte_offset + image_desc.m_alpha_slice_byte_offset) : 0, image_desc.m_alpha_slice_byte_length,
				decode_flags, m_has_alpha,
				m_is_video, output_row_pitch_in_blocks_or_pixels, &pState->m_transcoder_state, output_rows_in_pixels))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: ETC1S transcode_image() failed, this is either a bug or the file is corrupted/invalid\n");
				return false;
			}
		}
		else if (m_format == basist::basis_tex_format::cUASTC4x4)
		{
			// Compute length and offset to uncompressed 2D UASTC texture data, given the face/layer indices.
			assert(uncomp_level_data_size == m_levels[level_index].m_uncompressed_byte_length);
			const uint32_t total_2D_image_size = num_blocks_x * num_blocks_y * KTX2_UASTC_BLOCK_SIZE;
						
			const uint32_t uncomp_ofs = (layer_index * m_header.m_face_count + face_index) * total_2D_image_size;

			// Sanity checks
			if (uncomp_ofs >= uncomp_level_data_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: uncomp_ofs >= total_2D_image_size\n");
				return false;
			}

			if ((uncomp_level_data_size - uncomp_ofs) < total_2D_image_size)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: (uncomp_level_data_size - uncomp_ofs) < total_2D_image_size\n");
				return false;
			}

			if (!m_uastc_transcoder.transcode_image(fmt,
				pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels,
				(const uint8_t*)pUncomp_level_data + uncomp_ofs, (uint32_t)total_2D_image_size, num_blocks_x, num_blocks_y, level_width, level_height, level_index,
				0, (uint32_t)total_2D_image_size,
				decode_flags, m_has_alpha, m_is_video, output_row_pitch_in_blocks_or_pixels, nullptr, output_rows_in_pixels, channel0, channel1))
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: UASTC transcode_image() failed, this is either a bug or the file is corrupted/invalid\n");
				return false;
			}
		}
		else
		{
			// Shouldn't get here.
			BASISU_DEVEL_ERROR("ktx2_transcoder::transcode_image_2D: Internal error\n");
			assert(0);
			return false;
		}

		return true;
	}